

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_pcm_f32_to_u8(void *dst,void *src,ma_uint64 count,ma_dither_mode ditherMode)

{
  float fVar1;
  undefined1 auVar2 [16];
  ma_uint64 mVar3;
  int iVar4;
  int iVar5;
  ma_lcg mVar6;
  int iVar7;
  undefined1 uVar8;
  float fVar9;
  undefined1 auVar10 [16];
  
  auVar2 = _DAT_00115660;
  if (count != 0) {
    mVar3 = 0;
    mVar6.state = g_maLCG.state;
    do {
      if (ditherMode == ma_dither_mode_triangle) {
        iVar4 = mVar6.state * 0xbc8f;
        iVar4 = iVar4 + ((int)((long)iVar4 * 0x40000001 >> 0x3d) - (iVar4 >> 0x1f)) * -0x7fffffff;
        iVar5 = iVar4 * 0xbc8f;
        iVar7 = (int)((long)iVar5 * 0x40000001 >> 0x3d) - (iVar5 >> 0x1f);
        mVar6.state = iVar7 * -0x80000000 + iVar5 + iVar7;
        auVar10._0_8_ = (double)iVar4;
        auVar10._8_8_ = (double)mVar6.state;
        auVar10 = divpd(auVar10,auVar2);
        fVar9 = (float)auVar10._8_8_ * 0.007874016 + 0.0 +
                (float)auVar10._0_8_ * 0.0078125 + -0.0078125;
        g_maLCG.state = mVar6.state;
      }
      else {
        fVar9 = 0.0;
        if (ditherMode == ma_dither_mode_rectangle) {
          iVar4 = mVar6.state * 0xbc8f;
          iVar5 = (int)((long)iVar4 * 0x40000001 >> 0x3d) - (iVar4 >> 0x1f);
          mVar6.state = iVar5 * -0x80000000 + iVar4 + iVar5;
          fVar9 = ((float)mVar6.state / 2.1474836e+09) * 0.015686516 + -0.0078125;
          g_maLCG.state = mVar6.state;
        }
      }
      fVar9 = *(float *)((long)src + mVar3 * 4) + fVar9;
      if (-1.0 <= fVar9) {
        fVar1 = 1.0;
        if (fVar9 <= 1.0) {
          fVar1 = fVar9;
        }
        uVar8 = (undefined1)(int)((fVar1 + 1.0) * 127.5);
      }
      else {
        uVar8 = 0;
      }
      *(undefined1 *)((long)dst + mVar3) = uVar8;
      mVar3 = mVar3 + 1;
    } while (count != mVar3);
  }
  return;
}

Assistant:

static MA_INLINE void ma_pcm_f32_to_u8__reference(void* dst, const void* src, ma_uint64 count, ma_dither_mode ditherMode)
{
    ma_uint64 i;

    ma_uint8* dst_u8 = (ma_uint8*)dst;
    const float* src_f32 = (const float*)src;

    float ditherMin = 0;
    float ditherMax = 0;
    if (ditherMode != ma_dither_mode_none) {
        ditherMin = 1.0f / -128;
        ditherMax = 1.0f /  127;
    }

    for (i = 0; i < count; i += 1) {
        float x = src_f32[i];
        x = x + ma_dither_f32(ditherMode, ditherMin, ditherMax);
        x = ((x < -1) ? -1 : ((x > 1) ? 1 : x));    /* clip */
        x = x + 1;                                  /* -1..1 to 0..2 */
        x = x * 127.5f;                             /* 0..2 to 0..255 */

        dst_u8[i] = (ma_uint8)x;
    }
}